

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char local_b1;
  char *pcStack_b0;
  char s;
  char *store;
  _Bool endquote;
  _Bool escape;
  char *netrcbuffer;
  char *pcStack_90;
  _Bool quoted;
  char *tok_end;
  char *tok;
  dynbuf buf;
  _Bool done;
  int state_our_login;
  char state_password;
  char state_login;
  host_lookup_state state;
  _Bool password_alloc;
  _Bool login_alloc;
  _Bool specific_login;
  char *password;
  char *login;
  int retcode;
  FILE *file;
  char *netrcfile_local;
  char **passwordp_local;
  char **loginp_local;
  char *host_local;
  
  login._4_4_ = 1;
  password = *loginp;
  _state = *passwordp;
  bVar8 = false;
  if (password != (char *)0x0) {
    bVar8 = *password != '\0';
  }
  bVar3 = false;
  bVar5 = false;
  state_our_login = 0;
  bVar2 = false;
  bVar4 = false;
  bVar10 = true;
  __stream = fopen64(netrcfile,"r");
  if (__stream != (FILE *)0x0) {
    buf.toobig._7_1_ = 0;
    Curl_dyn_init((dynbuf *)&tok,0x1000);
LAB_0016e4d6:
    bVar9 = false;
    if ((buf.toobig._7_1_ & 1) == 0) {
      iVar6 = Curl_get_line((dynbuf *)&tok,(FILE *)__stream);
      bVar9 = iVar6 != 0;
    }
    if (bVar9) {
      tok_end = Curl_dyn_ptr((dynbuf *)&tok);
      if (state_our_login == 3) goto code_r0x0016e522;
      goto LAB_0016e558;
    }
LAB_0016ea7e:
    Curl_dyn_free((dynbuf *)&tok);
    if (login._4_4_ == 0) {
      if (bVar3) {
        if (*loginp != (char *)0x0) {
          (*Curl_cfree)(*loginp);
        }
        *loginp = password;
      }
      if (bVar5) {
        if (*passwordp != (char *)0x0) {
          (*Curl_cfree)(*passwordp);
        }
        *passwordp = _state;
      }
    }
    else {
      if (bVar3) {
        (*Curl_cfree)(password);
      }
      if (bVar5) {
        (*Curl_cfree)(_state);
      }
    }
    fclose(__stream);
  }
  return login._4_4_;
code_r0x0016e522:
  if ((*tok_end == '\n') || (*tok_end == '\r')) {
    state_our_login = 0;
LAB_0016e558:
    while (tok_end != (char *)0x0) {
      while( true ) {
        bVar9 = true;
        if (*tok_end != ' ') {
          bVar9 = *tok_end == '\t';
        }
        if (!bVar9) break;
        tok_end = tok_end + 1;
      }
      if ((*tok_end == '\0') || (*tok_end == '#')) break;
      pcStack_90 = tok_end;
      if (*tok_end == '\"') {
        bVar9 = false;
        bVar1 = false;
        pcStack_b0 = tok_end;
        pcStack_90 = tok_end + 1;
        while (*pcStack_90 != '\0') {
          local_b1 = *pcStack_90;
          if (bVar9) {
            bVar9 = false;
            if (local_b1 == 'n') {
              local_b1 = '\n';
            }
            else if (local_b1 == 'r') {
              local_b1 = '\r';
            }
            else if (local_b1 == 't') {
              local_b1 = '\t';
            }
LAB_0016e782:
            *pcStack_b0 = local_b1;
            pcStack_90 = pcStack_90 + 1;
            pcStack_b0 = pcStack_b0 + 1;
          }
          else {
            if (local_b1 != '\\') {
              if (local_b1 != '\"') goto LAB_0016e782;
              pcStack_90 = pcStack_90 + 1;
              bVar1 = true;
              break;
            }
            bVar9 = true;
            pcStack_90 = pcStack_90 + 1;
          }
        }
        *pcStack_b0 = '\0';
        if ((bVar9) || (!bVar1)) {
          login._4_4_ = -1;
          goto LAB_0016ea7e;
        }
      }
      else {
        while( true ) {
          bVar9 = true;
          if (((*pcStack_90 != ' ') && (bVar9 = true, *pcStack_90 != '\t')) &&
             (bVar9 = false, '\t' < *pcStack_90)) {
            bVar9 = *pcStack_90 < '\x0e';
          }
          if (bVar9) break;
          pcStack_90 = pcStack_90 + 1;
        }
        *pcStack_90 = '\0';
      }
      if (((password != (char *)0x0) && (*password != '\0')) &&
         ((_state != (char *)0x0 && (*_state != '\0')))) {
        buf.toobig._7_1_ = 1;
        break;
      }
      switch(state_our_login) {
      case 0:
        iVar6 = curl_strequal("macdef",tok_end);
        if (iVar6 == 0) {
          iVar6 = curl_strequal("machine",tok_end);
          if (iVar6 == 0) {
            iVar6 = curl_strequal("default",tok_end);
            if (iVar6 != 0) {
              state_our_login = 2;
              login._4_4_ = 0;
            }
          }
          else {
            state_our_login = 1;
          }
        }
        else {
          state_our_login = 3;
        }
        break;
      case 1:
        iVar6 = curl_strequal(host,tok_end);
        if (iVar6 == 0) {
          state_our_login = 0;
        }
        else {
          state_our_login = 2;
          login._4_4_ = 0;
        }
        break;
      case 2:
        if (bVar2) {
          if (bVar8) {
            iVar6 = Curl_timestrcmp(password,tok_end);
            bVar10 = iVar6 == 0;
          }
          else if ((password == (char *)0x0) ||
                  (iVar6 = Curl_timestrcmp(password,tok_end), iVar6 != 0)) {
            if (bVar3) {
              (*Curl_cfree)(password);
              bVar3 = false;
            }
            password = (*Curl_cstrdup)(tok_end);
            if (password == (char *)0x0) {
              login._4_4_ = -1;
              goto LAB_0016ea7e;
            }
            bVar3 = true;
          }
          bVar2 = false;
        }
        else if (bVar4) {
          if (((bVar10) || (!bVar8)) &&
             ((_state == (char *)0x0 || (iVar6 = Curl_timestrcmp(_state,tok_end), iVar6 != 0)))) {
            if (bVar5) {
              (*Curl_cfree)(_state);
              bVar5 = false;
            }
            _state = (*Curl_cstrdup)(tok_end);
            if (_state == (char *)0x0) {
              login._4_4_ = -1;
              goto LAB_0016ea7e;
            }
            bVar5 = true;
          }
          bVar4 = false;
        }
        else {
          iVar6 = curl_strequal("login",tok_end);
          if (iVar6 == 0) {
            iVar6 = curl_strequal("password",tok_end);
            if (iVar6 == 0) {
              iVar6 = curl_strequal("machine",tok_end);
              if (iVar6 != 0) {
                state_our_login = 1;
                bVar10 = false;
              }
            }
            else {
              bVar4 = true;
            }
          }
          else {
            bVar2 = true;
          }
        }
        break;
      case 3:
        sVar7 = strlen(tok_end);
        if (sVar7 == 0) {
          state_our_login = 0;
        }
      }
      tok_end = pcStack_90 + 1;
    }
  }
  goto LAB_0016e4d6;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = TRUE;  /* With specific_login, found *our* login
                                  name (or login-less line) */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    bool done = FALSE;
    struct dynbuf buf;
    Curl_dyn_init(&buf, MAX_NETRC_LINE);

    while(!done && Curl_get_line(&buf, file)) {
      char *tok;
      char *tok_end;
      bool quoted;
      char *netrcbuffer = Curl_dyn_ptr(&buf);
      if(state == MACDEF) {
        if((netrcbuffer[0] == '\n') || (netrcbuffer[0] == '\r'))
          state = NOTHING;
        else
          continue;
      }
      tok = netrcbuffer;
      while(tok) {
        while(ISBLANK(*tok))
          tok++;
        /* tok is first non-space letter */
        if(!*tok || (*tok == '#'))
          /* end of line or the rest is a comment */
          break;

        /* leading double-quote means quoted string */
        quoted = (*tok == '\"');

        tok_end = tok;
        if(!quoted) {
          while(!ISSPACE(*tok_end))
            tok_end++;
          *tok_end = 0;
        }
        else {
          bool escape = FALSE;
          bool endquote = FALSE;
          char *store = tok;
          tok_end++; /* pass the leading quote */
          while(*tok_end) {
            char s = *tok_end;
            if(escape) {
              escape = FALSE;
              switch(s) {
              case 'n':
                s = '\n';
                break;
              case 'r':
                s = '\r';
                break;
              case 't':
                s = '\t';
                break;
              }
            }
            else if(s == '\\') {
              escape = TRUE;
              tok_end++;
              continue;
            }
            else if(s == '\"') {
              tok_end++; /* pass the ending quote */
              endquote = TRUE;
              break;
            }
            *store++ = s;
            tok_end++;
          }
          *store = 0;
          if(escape || !endquote) {
            /* bad syntax, get out */
            retcode = NETRC_FAILED;
            goto out;
          }
        }

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("macdef", tok)) {
            /* Define a macro. A macro is defined with the specified name; its
               contents begin with the next .netrc line and continue until a
               null line (consecutive new-line characters) is encountered. */
            state = MACDEF;
          }
          else if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case MACDEF:
          if(!strlen(tok)) {
            state = NOTHING;
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = !Curl_timestrcmp(login, tok);
            }
            else if(!login || Curl_timestrcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
               && (!password || Curl_timestrcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there is machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */
        tok = ++tok_end;
      }
    } /* while Curl_get_line() */

out:
    Curl_dyn_free(&buf);
    if(!retcode) {
      /* success */
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}